

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureCubeMapArrayImageOpCompute::iterate(TextureCubeMapArrayImageOpCompute *this)

{
  GLuint *id;
  GLuint *id_00;
  GLuint *id_01;
  GLuint *id_02;
  GLuint *id_03;
  GLuint *id_04;
  GLuint width;
  GLuint height;
  GLuint depth;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar8;
  char *description;
  ulong __new_size;
  size_t __n;
  byte local_131;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uIntData;
  vector<int,_std::allocator<int>_> intData;
  vector<float,_std::allocator<float>_> floatData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uIntClean;
  vector<int,_std::allocator<int>_> intClean;
  vector<float,_std::allocator<float>_> floatClean;
  long lVar7;
  
  initTest(this);
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x1680))(this->m_po_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x209);
  floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id = &this->m_image_read_to_id;
  id_00 = &this->m_image_write_to_id;
  id_01 = &this->m_iimage_read_to_id;
  id_02 = &this->m_iimage_write_to_id;
  id_03 = &this->m_uimage_read_to_id;
  id_04 = &this->m_uimage_write_to_id;
  local_131 = 1;
  for (lVar8 = 8; lVar8 != 0x38; lVar8 = lVar8 + 0xc) {
    width = *(GLuint *)(&UNK_017bfbe8 + lVar8);
    height = *(GLuint *)(&UNK_017bfbec + lVar8);
    depth = *(GLuint *)((long)&m_resolutions + lVar8);
    __new_size = (ulong)(width * height * depth * 4);
    std::vector<float,_std::allocator<float>_>::resize(&floatData,__new_size);
    std::vector<float,_std::allocator<float>_>::resize(&floatClean,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(&intData,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(&intClean,__new_size);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&uIntData,__new_size);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&uIntClean,__new_size);
    __n = __new_size << 2;
    memset(floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start,0,__n);
    memset(intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,__n);
    memset(uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start,0,__n);
    fillData<float>(floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,width,height,depth,4,1.5);
    fillData<int>(intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,width,height,depth,4,-1);
    fillData<unsigned_int>
              (uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,width,height,depth,4,1);
    uVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar6 & 0x300) != 0) {
      configureTexture<float>
                ((this->super_TestCaseBase).m_context,id,width,height,depth,ST_MUTABLE,0x8814,0x1908
                 ,0x1406,floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start);
      configureTexture<float>
                ((this->super_TestCaseBase).m_context,id_00,width,height,depth,ST_MUTABLE,0x8814,
                 0x1908,0x1406,
                 floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      configureTexture<int>
                ((this->super_TestCaseBase).m_context,id_01,width,height,depth,ST_MUTABLE,0x8d82,
                 0x8d99,0x1404,
                 intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      configureTexture<int>
                ((this->super_TestCaseBase).m_context,id_02,width,height,depth,ST_MUTABLE,0x8d82,
                 0x8d99,0x1404,
                 intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      configureTexture<unsigned_int>
                ((this->super_TestCaseBase).m_context,id_03,width,height,depth,ST_MUTABLE,0x8d70,
                 0x8d99,0x1405,
                 uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      configureTexture<unsigned_int>
                ((this->super_TestCaseBase).m_context,id_04,width,height,depth,ST_MUTABLE,0x8d70,
                 0x8d99,0x1405,
                 uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar7 + 0x80))(0,*id,0,1,0,35000,0x8814);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x248);
      (**(code **)(lVar7 + 0x80))(1,*id_01,0,1,0,35000,0x8d82);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x24a);
      (**(code **)(lVar7 + 0x80))(2,*id_03,0,1,0,35000,0x8d70);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x24c);
      (**(code **)(lVar7 + 0x80))(3,*id_00,0,1,0,0x88b9,0x8814);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x24f);
      (**(code **)(lVar7 + 0x80))(4,*id_02,0,1,0,0x88b9,0x8d82);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x252);
      (**(code **)(lVar7 + 0x80))(5,*id_04,0,1,0,0x88b9,0x8d70);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x255);
      runShaders(this,width,height,depth);
      bVar1 = checkResults<float>((this->super_TestCaseBase).m_context,this->m_copy_po_id,
                                  this->m_image_write_to_id,width,height,depth,4,0x1908,0x1406,
                                  ST_MUTABLE,
                                  floatData.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      bVar2 = checkResults<int>((this->super_TestCaseBase).m_context,this->m_copy_po_id,
                                this->m_iimage_write_to_id,width,height,depth,4,0x8d99,0x1404,
                                ST_MUTABLE,
                                intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
      bVar3 = checkResults<unsigned_int>
                        ((this->super_TestCaseBase).m_context,this->m_copy_po_id,
                         this->m_uimage_write_to_id,width,height,depth,4,0x8d99,0x1405,ST_MUTABLE,
                         uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      removeTextures(this);
      local_131 = bVar3 & local_131 & (bVar1 && bVar2);
    }
    configureTexture<float>
              ((this->super_TestCaseBase).m_context,id,width,height,depth,ST_IMMUTABLE,0x8814,0x1908
               ,0x1406,floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
    configureTexture<float>
              ((this->super_TestCaseBase).m_context,id_00,width,height,depth,ST_IMMUTABLE,0x8814,
               0x1908,0x1406,
               floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    configureTexture<int>
              ((this->super_TestCaseBase).m_context,id_01,width,height,depth,ST_IMMUTABLE,0x8d82,
               0x8d99,0x1404,
               intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start);
    configureTexture<int>
              ((this->super_TestCaseBase).m_context,id_02,width,height,depth,ST_IMMUTABLE,0x8d82,
               0x8d99,0x1404,
               intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    configureTexture<unsigned_int>
              ((this->super_TestCaseBase).m_context,id_03,width,height,depth,ST_IMMUTABLE,0x8d70,
               0x8d99,0x1405,
               uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    configureTexture<unsigned_int>
              ((this->super_TestCaseBase).m_context,id_04,width,height,depth,ST_IMMUTABLE,0x8d70,
               0x8d99,0x1405,
               uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    (**(code **)(lVar7 + 0x80))(0,*id,0,1,0,35000,0x8814);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x285);
    (**(code **)(lVar7 + 0x80))(1,*id_01,0,1,0,35000,0x8d82);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x287);
    (**(code **)(lVar7 + 0x80))(2,*id_03,0,1,0,35000,0x8d70);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x289);
    (**(code **)(lVar7 + 0x80))(3,*id_00,0,1,0,0x88b9,0x8814);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x28c);
    (**(code **)(lVar7 + 0x80))(4,*id_02,0,1,0,0x88b9,0x8d82);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x28f);
    (**(code **)(lVar7 + 0x80))(5,*id_04,0,1,0,0x88b9,0x8d70);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x292);
    runShaders(this,width,height,depth);
    bVar1 = checkResults<float>((this->super_TestCaseBase).m_context,this->m_copy_po_id,
                                this->m_image_write_to_id,width,height,depth,4,0x1908,0x1406,
                                ST_IMMUTABLE,
                                floatData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
    bVar2 = checkResults<int>((this->super_TestCaseBase).m_context,this->m_copy_po_id,
                              this->m_iimage_write_to_id,width,height,depth,4,0x8d99,0x1404,
                              ST_IMMUTABLE,
                              intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
    bVar3 = checkResults<unsigned_int>
                      ((this->super_TestCaseBase).m_context,this->m_copy_po_id,
                       this->m_uimage_write_to_id,width,height,depth,4,0x8d99,0x1405,ST_IMMUTABLE,
                       uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    removeTextures(this);
    local_131 = bVar3 & local_131 & (bVar1 && bVar2);
  }
  description = "Fail";
  if (local_131 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_131 & QP_TEST_RESULT_FAIL,description);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&intClean.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&intData.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&floatClean.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&floatData.super__Vector_base<float,_std::allocator<float>_>);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayImageOpCompute::iterate()
{
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	bool test_passed = true;

	std::vector<glw::GLfloat> floatData;
	std::vector<glw::GLfloat> floatClean;
	std::vector<glw::GLint>   intData;
	std::vector<glw::GLint>   intClean;
	std::vector<glw::GLuint>  uIntData;
	std::vector<glw::GLuint>  uIntClean;

	/* Execute test throught all resolutions, storage types, and image types */
	for (glw::GLuint res_index = 0; res_index < m_n_resolutions; ++res_index)
	{
		glw::GLuint width  = m_resolutions[res_index][DL_WIDTH];
		glw::GLuint height = m_resolutions[res_index][DL_HEIGHT];
		glw::GLuint depth  = m_resolutions[res_index][DL_DEPTH];

		/* Allocate memory buffers for data */
		floatData.resize(width * height * depth * m_n_components);
		floatClean.resize(width * height * depth * m_n_components);
		intData.resize(width * height * depth * m_n_components);
		intClean.resize(width * height * depth * m_n_components);
		uIntData.resize(width * height * depth * m_n_components);
		uIntClean.resize(width * height * depth * m_n_components);

		memset(&floatClean[0], 0, width * height * depth * m_n_components * sizeof(glw::GLfloat));
		memset(&intClean[0], 0, width * height * depth * m_n_components * sizeof(glw::GLint));
		memset(&uIntClean[0], 0, width * height * depth * m_n_components * sizeof(glw::GLuint));

		/* Fill buffers with expected data*/
		fillData<glw::GLfloat>(&floatData[0], width, height, depth, m_n_components, m_f_base);
		fillData<glw::GLint>(&intData[0], width, height, depth, m_n_components, m_i_base);
		fillData<glw::GLuint>(&uIntData[0], width, height, depth, m_n_components, m_ui_base);

		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{

			/**
			 * Mutable textures cannot be bound as image textures on ES, but can be on
			 * desktop GL.
			 * */

			/* Work on mutable texture storage */

			/* Generate texture objects */
			configureTexture<glw::GLfloat>(m_context, &m_image_read_to_id, width, height, depth, ST_MUTABLE, GL_RGBA32F,
										   GL_RGBA, GL_FLOAT, &floatData[0]);
			configureTexture<glw::GLfloat>(m_context, &m_image_write_to_id, width, height, depth, ST_MUTABLE,
										   GL_RGBA32F, GL_RGBA, GL_FLOAT, &floatClean[0]);

			configureTexture<glw::GLint>(m_context, &m_iimage_read_to_id, width, height, depth, ST_MUTABLE, GL_RGBA32I,
										 GL_RGBA_INTEGER, GL_INT, &intData[0]);
			configureTexture<glw::GLint>(m_context, &m_iimage_write_to_id, width, height, depth, ST_MUTABLE, GL_RGBA32I,
										 GL_RGBA_INTEGER, GL_INT, &intClean[0]);

			configureTexture<glw::GLuint>(m_context, &m_uimage_read_to_id, width, height, depth, ST_MUTABLE,
										  GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntData[0]);
			configureTexture<glw::GLuint>(m_context, &m_uimage_write_to_id, width, height, depth, ST_MUTABLE,
										  GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntClean[0]);

			/* Bind texture objects to image units */
			gl.bindImageTexture(IF_IMAGE, m_image_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32F);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_IIMAGE, m_iimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32I);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_UIMAGE, m_uimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_IMAGE + m_n_image_formats, m_image_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
								GL_RGBA32F);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_IIMAGE + m_n_image_formats, m_iimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
								GL_RGBA32I);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_UIMAGE + m_n_image_formats, m_uimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
								GL_RGBA32UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");

			/* Call shaders */
			runShaders(width, height, depth);

			/* Check results */
			if (!checkResults<glw::GLfloat>(m_context, m_copy_po_id, m_image_write_to_id, width, height, depth,
											m_n_components, GL_RGBA, GL_FLOAT, ST_MUTABLE, &floatData[0]))
			{
				test_passed = false;
			}

			if (!checkResults<glw::GLint>(m_context, m_copy_po_id, m_iimage_write_to_id, width, height, depth,
										  m_n_components, GL_RGBA_INTEGER, GL_INT, ST_MUTABLE, &intData[0]))
			{
				test_passed = false;
			}

			if (!checkResults<glw::GLuint>(m_context, m_copy_po_id, m_uimage_write_to_id, width, height, depth,
										   m_n_components, GL_RGBA_INTEGER, GL_UNSIGNED_INT, ST_MUTABLE, &uIntData[0]))
			{
				test_passed = false;
			}

			/* Delete textures */
			removeTextures();
		}

		/* Work on immutable texture storage */

		/* Generate texture objects */
		configureTexture<glw::GLfloat>(m_context, &m_image_read_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32F,
									   GL_RGBA, GL_FLOAT, &floatData[0]);
		configureTexture<glw::GLfloat>(m_context, &m_image_write_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32F,
									   GL_RGBA, GL_FLOAT, &floatClean[0]);

		configureTexture<glw::GLint>(m_context, &m_iimage_read_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32I,
									 GL_RGBA_INTEGER, GL_INT, &intData[0]);
		configureTexture<glw::GLint>(m_context, &m_iimage_write_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32I,
									 GL_RGBA_INTEGER, GL_INT, &intClean[0]);

		configureTexture<glw::GLuint>(m_context, &m_uimage_read_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32UI,
									  GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntData[0]);
		configureTexture<glw::GLuint>(m_context, &m_uimage_write_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32UI,
									  GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntClean[0]);

		/* Bind texture objects to image units */
		gl.bindImageTexture(IF_IMAGE, m_image_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32F);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_IIMAGE, m_iimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_UIMAGE, m_uimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_IMAGE + m_n_image_formats, m_image_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
							GL_RGBA32F);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_IIMAGE + m_n_image_formats, m_iimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
							GL_RGBA32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_UIMAGE + m_n_image_formats, m_uimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
							GL_RGBA32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");

		/* Call shaders */
		runShaders(width, height, depth);

		/* Check results */
		if (!checkResults<glw::GLfloat>(m_context, m_copy_po_id, m_image_write_to_id, width, height, depth,
										m_n_components, GL_RGBA, GL_FLOAT, ST_IMMUTABLE, &floatData[0]))
		{
			test_passed = false;
		}

		if (!checkResults<glw::GLint>(m_context, m_copy_po_id, m_iimage_write_to_id, width, height, depth,
									  m_n_components, GL_RGBA_INTEGER, GL_INT, ST_IMMUTABLE, &intData[0]))
		{
			test_passed = false;
		}

		if (!checkResults<glw::GLuint>(m_context, m_copy_po_id, m_uimage_write_to_id, width, height, depth,
									   m_n_components, GL_RGBA_INTEGER, GL_UNSIGNED_INT, ST_IMMUTABLE, &uIntData[0]))
		{
			test_passed = false;
		}

		/* Delete textures */
		removeTextures();
	}

	if (test_passed)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}